

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O0

void prvTidySortAttributes(TidyDocImpl *doc,Node *node,TidyAttrSortStrategy strat)

{
  AttVal *pAVar1;
  Node *pNStack_18;
  TidyAttrSortStrategy strat_local;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  for (pNStack_18 = node; pNStack_18 != (Node *)0x0; pNStack_18 = pNStack_18->next) {
    pAVar1 = SortAttVal(doc,pNStack_18->attributes,strat);
    pNStack_18->attributes = pAVar1;
    if (pNStack_18->content != (Node *)0x0) {
      prvTidySortAttributes(doc,pNStack_18->content,strat);
    }
  }
  return;
}

Assistant:

void TY_(SortAttributes)(TidyDocImpl* doc, Node* node, TidyAttrSortStrategy strat)
{
    while (node)
    {
        node->attributes = SortAttVal( doc, node->attributes, strat );
        if (node->content)
            TY_(SortAttributes)(doc, node->content, strat);
        node = node->next;
    }
}